

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cpp
# Opt level: O3

bool ReadFD(MemFile *file,shared_ptr<Disk> *disk)

{
  Disk *this;
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *path;
  Data *data;
  RegularFormat reg_fmt;
  pointer local_b8;
  size_type sStack_b0;
  size_type local_a8;
  int iStack_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  undefined8 uStack_86;
  bool bStack_7f;
  undefined1 local_70 [64];
  
  path = MemFile::name_abi_cxx11_(file);
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"fd","");
  bVar2 = IsFileExt(path,(string *)local_70);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (bVar2) {
    iVar3 = MemFile::size(file);
    if (iVar3 < 0x50000) {
      if (iVar3 == 0x14000) {
        reg_fmt = TO_80K_FM;
      }
      else {
        if (iVar3 != 0x28000) {
          return false;
        }
        if (opt.encoding == FM) {
          reg_fmt = TO_160K_FM;
        }
        else {
          reg_fmt = TO_160K_MFM;
        }
      }
    }
    else if (iVar3 == 0x50000) {
      reg_fmt = TO_320K_MFM;
    }
    else {
      if (iVar3 != 0xa0000) {
        return false;
      }
      reg_fmt = TO_640K_MFM;
    }
    Format::Format((Format *)local_70,reg_fmt);
    uStack_86 = local_70._50_8_;
    iStack_98 = local_70._32_4_;
    iStack_94 = local_70._36_4_;
    local_a8 = local_70._16_8_;
    iStack_a0 = local_70._24_4_;
    iStack_9c = local_70._28_4_;
    local_b8 = (pointer)local_70._0_8_;
    sStack_b0 = local_70._8_8_;
    iVar3 = Format::disk_size((Format *)&local_b8);
    iVar4 = MemFile::size(file);
    if (iVar3 != iVar4) {
      __assert_fail("fmt.disk_size() == file.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/fd.cpp"
                    ,0x2e,"bool ReadFD(MemFile &, std::shared_ptr<Disk> &)");
    }
    this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    data = MemFile::data(file);
    Disk::format(this,(Format *)&local_b8,data,bStack_7f);
    peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::_M_replace
              ((ulong)&peVar1->strType,0,(char *)(peVar1->strType)._M_string_length,0x1b0db3);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ReadFD(MemFile& file, std::shared_ptr<Disk>& disk)
{
    Format fmt;

    if (!IsFileExt(file.name(), "fd"))
        return false;

    switch (file.size())
    {
    case 655360:
        fmt = RegularFormat::TO_640K_MFM;
        break;

    case 327680:
        fmt = RegularFormat::TO_320K_MFM;
        break;

    case 163840:
        if (opt.encoding == Encoding::FM)
            fmt = RegularFormat::TO_160K_FM;
        else
            fmt = RegularFormat::TO_160K_MFM;
        break;

    case 81920:
        fmt = RegularFormat::TO_80K_FM;
        break;

    default:
        return false;
    }

    assert(fmt.disk_size() == file.size());
    disk->format(fmt, file.data(), fmt.cyls_first);
    disk->strType = "FD";
    return true;
}